

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_window.cpp
# Opt level: O1

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalWindow *window,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  idx_t *this_00;
  pointer pLVar1;
  __buckets_ptr pp_Var2;
  __node_base_ptr p_Var3;
  long lVar4;
  long lVar5;
  idx_t iVar6;
  ClientConfig *pCVar7;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var8;
  ClientContext *pCVar9;
  optional_ptr<duckdb::LogicalOperator,_true> oVar10;
  pointer this_01;
  pointer *__ptr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  __buckets_ptr pp_Var11;
  BoundOrderByNode *bound_order;
  __node_base_ptr p_Var12;
  idx_t iVar13;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_58;
  ClientContext *local_50;
  optional_ptr<duckdb::LogicalOperator,_true> local_48;
  __uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> local_40;
  LogicalOperator *local_38;
  
  local_40._M_t.
  super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>.
  super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl =
       (tuple<duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)
       (tuple<duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)this;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)(node_ptr + 2),0);
  PropagateStatistics((StatisticsPropagator *)&local_58,
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)window);
  _Var8._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (BaseStatistics *)0x0;
  pLVar1 = (window->super_LogicalOperator).types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (window->super_LogicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &(_Var8._M_head_impl)->type;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1);
  }
  if ((Optimizer *)local_58._M_head_impl != (Optimizer *)0x0) {
    operator_delete(local_58._M_head_impl);
  }
  local_48.ptr = node_ptr[5].
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_38 = node_ptr[6].
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (local_48.ptr != local_38) {
    do {
      this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_48.ptr);
      local_50 = (ClientContext *)
                 BaseExpression::Cast<duckdb::BoundWindowExpression>(&this_01->super_BaseExpression)
      ;
      pp_Var11 = (local_50->config).profiler_settings._M_h._M_buckets;
      pp_Var2 = (__buckets_ptr)(local_50->config).profiler_settings._M_h._M_bucket_count;
      if (pp_Var11 != pp_Var2) {
        pCVar7 = &local_50->config;
        do {
          PropagateExpression((StatisticsPropagator *)&local_58,
                              (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)window);
          ::std::
          vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                      *)&(pCVar7->profiler_settings)._M_h._M_element_count,
                     (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                      *)&local_58);
          _Var8._M_head_impl = local_58._M_head_impl;
          if ((Optimizer *)local_58._M_head_impl != (Optimizer *)0x0) {
            BaseStatistics::~BaseStatistics(local_58._M_head_impl);
            operator_delete(_Var8._M_head_impl);
          }
          pp_Var11 = pp_Var11 + 1;
        } while (pp_Var11 != pp_Var2);
      }
      p_Var3 = *(__node_base_ptr *)&(local_50->config).emit_profiler_output;
      for (p_Var12 = (local_50->config).profiler_settings._M_h._M_single_bucket; pCVar9 = local_50,
          p_Var12 != p_Var3; p_Var12 = p_Var12 + 3) {
        PropagateExpression((StatisticsPropagator *)&local_58,
                            (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)window);
        _Var8._M_head_impl = local_58._M_head_impl;
        local_58._M_head_impl = (BaseStatistics *)0x0;
        ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
        ::reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                 *)(p_Var12 + 2),_Var8._M_head_impl);
        _Var8._M_head_impl = local_58._M_head_impl;
        if ((Optimizer *)local_58._M_head_impl != (Optimizer *)0x0) {
          BaseStatistics::~BaseStatistics(local_58._M_head_impl);
          operator_delete(_Var8._M_head_impl);
        }
      }
      this_00 = &(local_50->config).nested_loop_join_threshold;
      if ((local_50->config).max_expression_depth == 0) {
        local_58._M_head_impl = (BaseStatistics *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&local_58);
      }
      else {
        PropagateExpression((StatisticsPropagator *)&local_58,
                            (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)window);
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&local_58);
      }
      _Var8._M_head_impl = local_58._M_head_impl;
      if ((Optimizer *)local_58._M_head_impl != (Optimizer *)0x0) {
        BaseStatistics::~BaseStatistics(local_58._M_head_impl);
        operator_delete(_Var8._M_head_impl);
      }
      lVar4._0_1_ = (pCVar9->config).query_verification_enabled;
      lVar4._1_1_ = (pCVar9->config).verify_external;
      lVar4._2_1_ = (pCVar9->config).verify_fetch_row;
      lVar4._3_1_ = (pCVar9->config).verify_serializer;
      lVar4._4_1_ = (pCVar9->config).enable_optimizer;
      lVar4._5_1_ = (pCVar9->config).enable_caching_operators;
      lVar4._6_1_ = (pCVar9->config).verify_parallelism;
      lVar4._7_1_ = (pCVar9->config).force_external;
      if (lVar4 == 0) {
        local_58._M_head_impl = (BaseStatistics *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&local_58);
      }
      else {
        PropagateExpression((StatisticsPropagator *)&local_58,
                            (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)window);
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&local_58);
      }
      _Var8._M_head_impl = local_58._M_head_impl;
      if ((Optimizer *)local_58._M_head_impl != (Optimizer *)0x0) {
        BaseStatistics::~BaseStatistics(local_58._M_head_impl);
        operator_delete(_Var8._M_head_impl);
      }
      lVar5._0_1_ = (pCVar9->config).force_no_cross_product;
      lVar5._1_1_ = (pCVar9->config).force_asof_iejoin;
      lVar5._2_1_ = (pCVar9->config).force_fetch_row;
      lVar5._3_1_ = (pCVar9->config).prefer_range_joins;
      lVar5._4_1_ = (pCVar9->config).use_replacement_scans;
      lVar5._5_3_ = *(undefined3 *)&(pCVar9->config).field_0xb5;
      if (lVar5 == 0) {
        local_58._M_head_impl = (BaseStatistics *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&local_58);
      }
      else {
        PropagateExpression((StatisticsPropagator *)&local_58,
                            (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)window);
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&local_58);
      }
      _Var8._M_head_impl = local_58._M_head_impl;
      if ((Optimizer *)local_58._M_head_impl != (Optimizer *)0x0) {
        BaseStatistics::~BaseStatistics(local_58._M_head_impl);
        operator_delete(_Var8._M_head_impl);
      }
      if ((pCVar9->config).perfect_ht_threshold == 0) {
        local_58._M_head_impl = (BaseStatistics *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&local_58);
      }
      else {
        PropagateExpression((StatisticsPropagator *)&local_58,
                            (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)window);
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&local_58);
      }
      oVar10.ptr = local_48.ptr;
      _Var8._M_head_impl = local_58._M_head_impl;
      if ((Optimizer *)local_58._M_head_impl != (Optimizer *)0x0) {
        BaseStatistics::~BaseStatistics(local_58._M_head_impl);
        operator_delete(_Var8._M_head_impl);
      }
      iVar6 = (pCVar9->config).partitioned_write_flush_threshold;
      for (iVar13 = (pCVar9->config).ordered_aggregate_threshold; iVar13 != iVar6;
          iVar13 = iVar13 + 0x18) {
        PropagateExpression((StatisticsPropagator *)&local_58,
                            (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)window);
        _Var8._M_head_impl = local_58._M_head_impl;
        local_58._M_head_impl = (BaseStatistics *)0x0;
        ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
        ::reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                 *)(iVar13 + 0x10),_Var8._M_head_impl);
        _Var8._M_head_impl = local_58._M_head_impl;
        if ((Optimizer *)local_58._M_head_impl != (Optimizer *)0x0) {
          BaseStatistics::~BaseStatistics(local_58._M_head_impl);
          operator_delete(_Var8._M_head_impl);
        }
      }
      local_48.ptr = (LogicalOperator *)&(oVar10.ptr)->type;
    } while (local_48.ptr != local_38);
  }
  *(pointer *)
   local_40._M_t.
   super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>.
   super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl =
       (window->super_LogicalOperator).types.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (window->super_LogicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)
         local_40._M_t.
         super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
         .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalWindow &window,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	// first propagate to the child
	node_stats = PropagateStatistics(window.children[0]);

	// then propagate to each of the order expressions
	for (auto &window_expr : window.expressions) {
		auto &over_expr = window_expr->Cast<BoundWindowExpression>();
		for (auto &expr : over_expr.partitions) {
			over_expr.partitions_stats.push_back(PropagateExpression(expr));
		}
		for (auto &bound_order : over_expr.orders) {
			bound_order.stats = PropagateExpression(bound_order.expression);
		}

		if (over_expr.start_expr) {
			over_expr.expr_stats.push_back(PropagateExpression(over_expr.start_expr));
		} else {
			over_expr.expr_stats.push_back(nullptr);
		}

		if (over_expr.end_expr) {
			over_expr.expr_stats.push_back(PropagateExpression(over_expr.end_expr));
		} else {
			over_expr.expr_stats.push_back(nullptr);
		}

		if (over_expr.offset_expr) {
			over_expr.expr_stats.push_back(PropagateExpression(over_expr.offset_expr));
		} else {
			over_expr.expr_stats.push_back(nullptr);
		}

		if (over_expr.default_expr) {
			over_expr.expr_stats.push_back(PropagateExpression(over_expr.default_expr));
		} else {
			over_expr.expr_stats.push_back(nullptr);
		}
		for (auto &bound_order : over_expr.arg_orders) {
			bound_order.stats = PropagateExpression(bound_order.expression);
		}
	}
	return std::move(node_stats);
}